

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O3

XXH_errorcode
VELOCYPACK_XXH3_64bits_reset_withSecret(XXH3_state_t *statePtr,void *secret,size_t secretSize)

{
  XXH_errorcode XVar1;
  
  XVar1 = XXH_ERROR;
  if (statePtr != (XXH3_state_t *)0x0) {
    statePtr->bufferedSize = 0;
    statePtr->reserved32 = 0;
    statePtr->nbStripesSoFar = 0;
    statePtr->totalLen = 0;
    statePtr->acc[0] = 0xc2b2ae3d;
    statePtr->acc[1] = 0x9e3779b185ebca87;
    statePtr->acc[2] = 0xc2b2ae3d27d4eb4f;
    statePtr->acc[3] = 0x165667b19e3779f9;
    statePtr->acc[4] = 0x85ebca77c2b2ae63;
    statePtr->acc[5] = 0x85ebca77;
    statePtr->acc[6] = 0x27d4eb2f165667c5;
    statePtr->acc[7] = 0x9e3779b1;
    statePtr->seed = 0;
    statePtr->extSecret = (uchar *)secret;
    statePtr->secretLimit = secretSize - 0x40;
    statePtr->nbStripesPerBlock = secretSize - 0x40 >> 3;
    if (secret != (void *)0x0) {
      XVar1 = (XXH_errorcode)(secretSize < 0x88);
    }
  }
  return XVar1;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH3_64bits_reset_withSecret(
    XXH3_state_t* statePtr, const void* secret, size_t secretSize) {
  if (statePtr == NULL) return XXH_ERROR;
  XXH3_reset_internal(statePtr, 0, secret, secretSize);
  if (secret == NULL) return XXH_ERROR;
  if (secretSize < XXH3_SECRET_SIZE_MIN) return XXH_ERROR;
  return XXH_OK;
}